

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O2

void rhash_sha384_init(sha512_ctx *ctx)

{
  ctx->length = 0;
  ctx->digest_length = 0x30;
  ctx->hash[0] = 0xcbbb9d5dc1059ed8;
  ctx->hash[1] = 0x629a292a367cd507;
  ctx->hash[2] = 0x9159015a3070dd17;
  ctx->hash[3] = 0x152fecd8f70e5939;
  ctx->hash[4] = 0x67332667ffc00b31;
  ctx->hash[5] = 0x8eb44a8768581511;
  ctx->hash[6] = 0xdb0c2e0d64f98fa7;
  ctx->hash[7] = 0x47b5481dbefa4fa4;
  return;
}

Assistant:

void rhash_sha384_init(struct sha512_ctx *ctx)
{
	/* Initial values from FIPS 180-3. These words were obtained by taking
	 * the first sixty-four bits of the fractional parts of the square
	 * roots of ninth through sixteenth prime numbers. */
	static const uint64_t SHA384_H0[8] = {
		I64(0xcbbb9d5dc1059ed8), I64(0x629a292a367cd507), I64(0x9159015a3070dd17),
		I64(0x152fecd8f70e5939), I64(0x67332667ffc00b31), I64(0x8eb44a8768581511),
		I64(0xdb0c2e0d64f98fa7), I64(0x47b5481dbefa4fa4)
	};

	ctx->length = 0;
	ctx->digest_length = sha384_hash_size;

	memcpy(ctx->hash, SHA384_H0, sizeof(ctx->hash));
}